

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int archive_read_format_iso9660_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  int64_t iVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  char *fmt;
  size_t sVar10;
  size_t __size;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  ssize_t bytes_read;
  size_t local_60;
  int64_t *local_58;
  void *local_50;
  size_t local_48;
  void **local_40;
  size_t *local_38;
  
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0xe0) != 0) {
    __archive_read_consume(a,*(long *)((long)pvVar1 + 0xe0));
    *(undefined8 *)((long)pvVar1 + 0xe0) = 0;
  }
  if (*(long *)((long)pvVar1 + 0xd8) < 1) {
    if (*(long *)((long)pvVar1 + 0x1e0) != 0) {
      *(undefined8 *)((long)pvVar1 + 0x1e0) =
           *(undefined8 *)(*(long *)((long)pvVar1 + 0x1e0) + 0x10);
    }
    if (*(ulong **)((long)pvVar1 + 0x1e0) == (ulong *)0x0) {
      *buff = (void *)0x0;
      *size = 0;
      *offset = *(int64_t *)((long)pvVar1 + 0xd0);
      iVar6 = 1;
      goto LAB_0014694e;
    }
    uVar11 = **(ulong **)((long)pvVar1 + 0x1e0);
    lVar9 = uVar11 - *(ulong *)((long)pvVar1 + 0xa0);
    if (*(ulong *)((long)pvVar1 + 0xa0) <= uVar11 && lVar9 != 0) {
      iVar6 = __archive_read_consume(a,lVar9);
      if (iVar6 < 0) goto LAB_0014694e;
      *(undefined8 *)((long)pvVar1 + 0xa0) = **(undefined8 **)((long)pvVar1 + 0x1e0);
    }
    if (**(ulong **)((long)pvVar1 + 0x1e0) < *(ulong *)((long)pvVar1 + 0xa0)) {
      archive_set_error(&a->archive,-1,"Ignoring out-of-order file (%s) %jd < %jd",
                        *(undefined8 *)((long)pvVar1 + 0x10));
      *buff = (void *)0x0;
      *size = 0;
      *offset = *(int64_t *)((long)pvVar1 + 0xd0);
      iVar6 = 0xffffffec;
      goto LAB_0014694e;
    }
    *(ulong *)((long)pvVar1 + 0xd8) = (*(ulong **)((long)pvVar1 + 0x1e0))[1];
  }
  if (*(int *)((long)pvVar1 + 0xe8) == 0) {
    pvVar4 = __archive_read_ahead(a,1,(ssize_t *)&local_60);
    *buff = pvVar4;
    if (local_60 == 0) {
      archive_set_error(&a->archive,-1,"Truncated input file");
    }
    if (*buff == (void *)0x0) goto LAB_0014664c;
    if ((long)*(size_t *)((long)pvVar1 + 0xd8) < (long)local_60) {
      local_60 = *(size_t *)((long)pvVar1 + 0xd8);
    }
    *size = local_60;
    *offset = *(int64_t *)((long)pvVar1 + 0xd0);
    *(long *)((long)pvVar1 + 0xd0) = *(long *)((long)pvVar1 + 0xd0) + local_60;
    *(long *)((long)pvVar1 + 0xd8) = *(long *)((long)pvVar1 + 0xd8) - local_60;
    *(size_t *)((long)pvVar1 + 0xe0) = local_60;
    *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + local_60;
  }
  else {
    pvVar1 = a->format->data;
    pvVar4 = __archive_read_ahead(a,1,(ssize_t *)&local_60);
    if ((long)local_60 < 1) {
      fmt = "Truncated zisofs file body";
LAB_0014663d:
      iVar3 = 0x54;
LAB_00146645:
      archive_set_error(&a->archive,iVar3,fmt);
LAB_0014664c:
      iVar6 = 0xffffffe2;
      goto LAB_0014694e;
    }
    if ((long)*(size_t *)((long)pvVar1 + 0xd8) < (long)local_60) {
      local_60 = *(size_t *)((long)pvVar1 + 0xd8);
    }
    sVar10 = local_60;
    if (*(int *)((long)pvVar1 + 0xf8) == 0) {
      uVar11 = ((*(long *)((long)pvVar1 + 0xf0) + (1L << (*(byte *)((long)pvVar1 + 0xec) & 0x3f))) -
                1U >> (*(byte *)((long)pvVar1 + 0xec) & 0x3f)) * 4 + 4;
      local_48 = local_60;
      local_50 = pvVar4;
      local_40 = buff;
      local_38 = size;
      if (*(ulong *)((long)pvVar1 + 0x140) < uVar11) {
        local_58 = offset;
        if (*(void **)((long)pvVar1 + 0x138) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 0x138));
        }
        __size = (uVar11 & 0xfffffffffffffc00) + 0x400;
        pvVar4 = malloc(__size);
        *(void **)((long)pvVar1 + 0x138) = pvVar4;
        if (pvVar4 != (void *)0x0) {
          *(size_t *)((long)pvVar1 + 0x140) = __size;
          offset = local_58;
          goto LAB_00146684;
        }
        archive_set_error(&a->archive,0xc,"No memory for zisofs decompression");
        cVar7 = '\x01';
        sVar10 = local_48;
        buff = local_40;
        pvVar4 = local_50;
        offset = local_58;
        size = local_38;
      }
      else {
LAB_00146684:
        size = local_38;
        sVar10 = local_48;
        *(ulong *)((long)pvVar1 + 0x148) = uVar11;
        uVar11 = 1L << (*(byte *)((long)pvVar1 + 0xec) & 0x3f);
        if (*(ulong *)((long)pvVar1 + 0x108) < uVar11) {
          if (*(void **)((long)pvVar1 + 0x100) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 0x100));
          }
          pvVar4 = malloc(uVar11);
          *(void **)((long)pvVar1 + 0x100) = pvVar4;
          if (pvVar4 == (void *)0x0) {
            archive_set_error(&a->archive,0xc,"No memory for zisofs decompression");
            cVar7 = '\x01';
            buff = local_40;
            pvVar4 = local_50;
            goto LAB_001468ed;
          }
        }
        sVar10 = local_48;
        *(ulong *)((long)pvVar1 + 0x108) = uVar11;
        uVar11 = *(ulong *)((long)pvVar1 + 0x128);
        pvVar4 = local_50;
        if (uVar11 < 0x10) {
          uVar12 = 0x10 - uVar11;
          if (local_48 < 0x10 - uVar11) {
            uVar12 = local_48;
          }
          memcpy((void *)((long)pvVar1 + uVar11 + 0x114),local_50,uVar12);
          *(long *)((long)pvVar1 + 0x128) = *(long *)((long)pvVar1 + 0x128) + uVar12;
          local_48 = sVar10 - uVar12;
          pvVar4 = (void *)((long)local_50 + uVar12);
        }
        buff = local_40;
        if ((*(int *)((long)pvVar1 + 0x130) == 0) && (*(long *)((long)pvVar1 + 0x128) == 0x10)) {
          bVar13 = *(long *)((long)pvVar1 + 0x114) != 0x7d6dbc99653e437;
          bVar14 = *(ulong *)((long)pvVar1 + 0xf0) != (ulong)*(uint *)((long)pvVar1 + 0x11c);
          bVar15 = *(char *)((long)pvVar1 + 0x120) != '\x04';
          bVar16 = *(uint *)((long)pvVar1 + 0xec) != (uint)*(byte *)((long)pvVar1 + 0x121);
          if ((bVar14 || bVar13) || (bVar16 || bVar15)) {
            local_58 = offset;
            archive_set_error(&a->archive,0x54,"Illegal zisofs file body");
            offset = local_58;
          }
          else {
            *(undefined4 *)((long)pvVar1 + 0x130) = 1;
          }
          cVar7 = '\x01';
          sVar10 = local_48;
          if ((bVar14 || bVar13) || (bVar16 || bVar15)) goto LAB_001468ed;
        }
        sVar10 = local_48;
        if (*(int *)((long)pvVar1 + 0x130) != 0) {
          uVar11 = *(ulong *)((long)pvVar1 + 0x150);
          uVar12 = *(ulong *)((long)pvVar1 + 0x148) - uVar11;
          if (uVar11 <= *(ulong *)((long)pvVar1 + 0x148) && uVar12 != 0) {
            if (local_48 < uVar12) {
              uVar12 = local_48;
            }
            local_58 = offset;
            memcpy((void *)(uVar11 + *(long *)((long)pvVar1 + 0x138)),pvVar4,uVar12);
            lVar9 = *(long *)((long)pvVar1 + 0x150) + uVar12;
            *(long *)((long)pvVar1 + 0x150) = lVar9;
            sVar10 = sVar10 - uVar12;
            pvVar4 = (void *)(uVar12 + (long)pvVar4);
            offset = local_58;
            if (lVar9 == *(long *)((long)pvVar1 + 0x148)) {
              *(undefined8 *)((long)pvVar1 + 0x158) = 0;
              *(undefined4 *)((long)pvVar1 + 0x160) = 0;
              *(undefined4 *)((long)pvVar1 + 0xf8) = 1;
            }
          }
        }
        cVar7 = (*(int *)((long)pvVar1 + 0xf8) == 0) * '\x02';
        buff = local_40;
      }
LAB_001468ed:
      if (cVar7 != '\x02') {
        iVar6 = 0xffffffe2;
        if (cVar7 != '\0') goto LAB_0014694e;
        goto LAB_0014630b;
      }
      sVar5 = 0;
    }
    else {
LAB_0014630b:
      if (*(int *)((long)pvVar1 + 0x160) == 0) {
        lVar9 = *(long *)((long)pvVar1 + 0x158);
        if (*(ulong *)((long)pvVar1 + 0x148) <= lVar9 + 4U) {
LAB_001465f2:
          fmt = "Illegal zisofs block pointers";
          goto LAB_0014663d;
        }
        uVar2 = *(uint *)(*(long *)((long)pvVar1 + 0x138) + lVar9);
        if ((local_60 - sVar10) + (ulong)*(uint *)((long)pvVar1 + 0x110) != (ulong)uVar2) {
          fmt = "Illegal zisofs block pointers(cannot seek)";
          goto LAB_0014663d;
        }
        uVar8 = *(uint *)(*(long *)((long)pvVar1 + 0x138) + 4 + lVar9);
        if (uVar8 < uVar2) goto LAB_001465f2;
        *(uint *)((long)pvVar1 + 0x160) = uVar8 - uVar2;
        *(ulong *)((long)pvVar1 + 0x158) = lVar9 + 4U;
        local_50 = pvVar4;
        if (*(int *)((long)pvVar1 + 0x1d8) == 0) {
          iVar3 = cm_zlib_inflateInit_((z_streamp)((long)pvVar1 + 0x168),"1.2.12",0x70);
        }
        else {
          iVar3 = cm_zlib_inflateReset((z_streamp)((long)pvVar1 + 0x168));
        }
        if (iVar3 == 0) {
          *(undefined4 *)((long)pvVar1 + 0x1d8) = 1;
          *(undefined8 *)((long)pvVar1 + 0x178) = 0;
          *(undefined8 *)((long)pvVar1 + 400) = 0;
          pvVar4 = local_50;
          goto LAB_00146319;
        }
        fmt = "Can\'t initialize zisofs decompression.";
        iVar3 = -1;
        goto LAB_00146645;
      }
LAB_00146319:
      uVar2 = *(uint *)((long)pvVar1 + 0x160);
      if ((ulong)uVar2 == 0) {
        memset(*(void **)((long)pvVar1 + 0x100),0,*(size_t *)((long)pvVar1 + 0x108));
        sVar5 = *(size_t *)((long)pvVar1 + 0x108);
      }
      else {
        *(void **)((long)pvVar1 + 0x168) = pvVar4;
        uVar8 = (uint)sVar10;
        if (uVar2 < sVar10) {
          uVar8 = uVar2;
        }
        *(uint *)((long)pvVar1 + 0x170) = uVar8;
        *(undefined8 *)((long)pvVar1 + 0x180) = *(undefined8 *)((long)pvVar1 + 0x100);
        *(undefined4 *)((long)pvVar1 + 0x188) = *(undefined4 *)((long)pvVar1 + 0x108);
        local_58 = offset;
        uVar2 = cm_zlib_inflate((z_streamp)((long)pvVar1 + 0x168),0);
        if (1 < uVar2) {
          archive_set_error(&a->archive,-1,"zisofs decompression failed (%d)",(ulong)uVar2);
          goto LAB_0014664c;
        }
        sVar5 = *(long *)((long)pvVar1 + 0x108) - (ulong)*(uint *)((long)pvVar1 + 0x188);
        lVar9 = *(long *)((long)pvVar1 + 0x168) - (long)pvVar4;
        sVar10 = sVar10 - lVar9;
        *(int *)((long)pvVar1 + 0x160) = *(int *)((long)pvVar1 + 0x160) - (int)lVar9;
        offset = local_58;
      }
    }
    lVar9 = local_60 - sVar10;
    *buff = *(void **)((long)pvVar1 + 0x100);
    *size = sVar5;
    *offset = *(int64_t *)((long)pvVar1 + 0xd0);
    *(long *)((long)pvVar1 + 0xd0) = *(long *)((long)pvVar1 + 0xd0) + sVar5;
    *(long *)((long)pvVar1 + 0xd8) = *(long *)((long)pvVar1 + 0xd8) - lVar9;
    *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + lVar9;
    *(int *)((long)pvVar1 + 0x110) = *(int *)((long)pvVar1 + 0x110) + (int)lVar9;
    *(long *)((long)pvVar1 + 0xe0) = *(long *)((long)pvVar1 + 0xe0) + lVar9;
  }
  iVar6 = 0;
LAB_0014694e:
  return (int)iVar6;
}

Assistant:

static int
archive_read_format_iso9660_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (iso9660->entry_bytes_unconsumed) {
		__archive_read_consume(a, iso9660->entry_bytes_unconsumed);
		iso9660->entry_bytes_unconsumed = 0;
	}

	if (iso9660->entry_bytes_remaining <= 0) {
		if (iso9660->entry_content != NULL)
			iso9660->entry_content = iso9660->entry_content->next;
		if (iso9660->entry_content == NULL) {
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_EOF);
		}
		/* Seek forward to the start of the entry. */
		if (iso9660->current_position < iso9660->entry_content->offset) {
			int64_t step;

			step = iso9660->entry_content->offset -
			    iso9660->current_position;
			step = __archive_read_consume(a, step);
			if (step < 0)
				return ((int)step);
			iso9660->current_position =
			    iso9660->entry_content->offset;
		}
		if (iso9660->entry_content->offset < iso9660->current_position) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file (%s) %jd < %jd",
			    iso9660->pathname.s,
			    (intmax_t)iso9660->entry_content->offset,
			    (intmax_t)iso9660->current_position);
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_WARN);
		}
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;
	}
	if (iso9660->entry_zisofs.pz)
		return (zisofs_read_data(a, buff, size, offset));

	*buff = __archive_read_ahead(a, 1, &bytes_read);
	if (bytes_read == 0)
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated input file");
	if (*buff == NULL)
		return (ARCHIVE_FATAL);
	if (bytes_read > iso9660->entry_bytes_remaining)
		bytes_read = (ssize_t)iso9660->entry_bytes_remaining;
	*size = bytes_read;
	*offset = iso9660->entry_sparse_offset;
	iso9660->entry_sparse_offset += bytes_read;
	iso9660->entry_bytes_remaining -= bytes_read;
	iso9660->entry_bytes_unconsumed = bytes_read;
	iso9660->current_position += bytes_read;
	return (ARCHIVE_OK);
}